

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O3

int rhash_get_hash_length(uint hash_id)

{
  rhash_info *prVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = hash_id & 0x3ff;
  if ((uVar3 & uVar3 - 1) == 0) {
    uVar2 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    prVar1 = rhash_info_table[uVar2].info;
    if (prVar1 != (rhash_info *)0x0) {
      if ((prVar1->flags & 1) == 0) {
        return (int)prVar1->digest_size * 2;
      }
      return (int)((prVar1->digest_size * 8 + 4) / 5);
    }
  }
  return 0;
}

Assistant:

RHASH_API int rhash_get_hash_length(unsigned hash_id)
{
	const rhash_info* info = rhash_info_by_id(hash_id);
	return (int)(info ? (info->flags & F_BS32 ?
		BASE32_LENGTH(info->digest_size) : info->digest_size * 2) : 0);
}